

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

XMLNode * XMLNode_get_child(XMLNode *node,int i_child)

{
  ulong uVar1;
  
  if (node != (XMLNode *)0x0) {
    if (i_child < 0) {
      return (XMLNode *)0x0;
    }
    if (node->init_value != 0x19770522) {
      return (XMLNode *)0x0;
    }
    if (i_child < node->n_children) {
      for (uVar1 = 0; (uint)node->n_children != uVar1; uVar1 = uVar1 + 1) {
        if (node->children[uVar1]->active == 0) {
          i_child = i_child + 1;
        }
        else if (uVar1 == (uint)i_child) {
          return node->children[uVar1];
        }
      }
    }
  }
  return (XMLNode *)0x0;
}

Assistant:

XMLNode* XMLNode_get_child(const XMLNode* node, int i_child)
{
	int i;
	
	if (node == NULL || node->init_value != XML_INIT_DONE || i_child < 0 || i_child >= node->n_children)
		return NULL;
	
	for (i = 0; i < node->n_children; i++) {
		if (!node->children[i]->active)
			i_child++;
		else if (i == i_child)
			return node->children[i];
	}
	
	return NULL;
}